

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void ecs_dbg_table(ecs_world_t *world,ecs_table_t *table,ecs_dbg_table_t *dbg_out)

{
  ulong uVar1;
  ecs_dbg_table_t *__dest;
  ecs_table_t *world_00;
  int32_t iVar2;
  void *pvVar3;
  ecs_type_t peVar4;
  ecs_type_t to_remove;
  ecs_data_t *peVar5;
  ecs_entity_t *peVar6;
  ecs_data_t *data;
  ecs_dbg_table_t base_table_dbg;
  ecs_dbg_entity_t base_dbg;
  ecs_dbg_table_t parent_table_dbg;
  ecs_dbg_entity_t parent_dbg;
  ecs_entity_t e;
  int32_t count;
  int32_t i;
  ecs_entity_t *entities;
  ecs_dbg_table_t *local_20;
  ecs_dbg_table_t *dbg_out_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  local_20 = dbg_out;
  dbg_out_local = (ecs_dbg_table_t *)table;
  table_local = (ecs_table_t *)world;
  _ecs_assert(dbg_out != (ecs_dbg_table_t *)0x0,2,(char *)0x0,"dbg_out != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
              ,0x15);
  if (local_20 == (ecs_dbg_table_t *)0x0) {
    __assert_fail("dbg_out != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
                  ,0x15,"void ecs_dbg_table(ecs_world_t *, ecs_table_t *, ecs_dbg_table_t *)");
  }
  _ecs_assert(dbg_out_local != (ecs_dbg_table_t *)0x0,2,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
              ,0x16);
  __dest = local_20;
  if (dbg_out_local != (ecs_dbg_table_t *)0x0) {
    memset(&entities,0,0x48);
    entities = (ecs_entity_t *)dbg_out_local;
    memcpy(__dest,&entities,0x48);
    local_20->type = (ecs_type_t)dbg_out_local->table;
    local_20->systems_matched = dbg_out_local->base_entities;
    pvVar3 = _ecs_vector_first((ecs_vector_t *)dbg_out_local->table,8,0x10);
    iVar2 = ecs_vector_count((ecs_vector_t *)dbg_out_local->table);
    for (e._4_4_ = 0; e._4_4_ < iVar2; e._4_4_ = e._4_4_ + 1) {
      uVar1 = *(ulong *)((long)pvVar3 + (long)e._4_4_ * 8);
      if ((uVar1 & 0xff00000000000000) == 0xfd00000000000000) {
        ecs_dbg_entity((ecs_world_t *)table_local,uVar1 & 0xffffffffffffff,
                       (ecs_dbg_entity_t *)&parent_table_dbg.entities_count);
        ecs_dbg_table((ecs_world_t *)table_local,(ecs_table_t *)parent_dbg.entity,
                      (ecs_dbg_table_t *)&base_dbg.row);
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->container,
                                (ecs_type_t)parent_dbg.table,(ecs_type_t)0x0);
        local_20->container = peVar4;
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->container,parent_table_dbg.type
                                ,(ecs_type_t)0x0);
        local_20->container = peVar4;
        peVar4 = ecs_type_add((ecs_world_t *)table_local,local_20->parent_entities,
                              uVar1 & 0xffffffffffffff);
        local_20->parent_entities = peVar4;
      }
      if ((uVar1 & 0xff00000000000000) == 0xfe00000000000000) {
        ecs_dbg_entity((ecs_world_t *)table_local,uVar1 & 0xffffffffffffff,
                       (ecs_dbg_entity_t *)&base_table_dbg.entities_count);
        ecs_dbg_table((ecs_world_t *)table_local,(ecs_table_t *)base_dbg.entity,
                      (ecs_dbg_table_t *)&data);
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->shared,
                                (ecs_type_t)base_dbg.table,(ecs_type_t)0x0);
        local_20->shared = peVar4;
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->shared,base_table_dbg.type,
                                (ecs_type_t)0x0);
        local_20->shared = peVar4;
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->shared,(ecs_type_t)0x0,
                                FLECS__TEcsName);
        world_00 = table_local;
        local_20->shared = peVar4;
        peVar4 = local_20->shared;
        to_remove = ecs_type_from_entity((ecs_world_t *)table_local,0x101);
        peVar4 = ecs_type_merge((ecs_world_t *)world_00,peVar4,(ecs_type_t)0x0,to_remove);
        local_20->shared = peVar4;
        peVar4 = ecs_type_merge((ecs_world_t *)table_local,local_20->shared,(ecs_type_t)0x0,
                                (ecs_type_t)dbg_out_local->table);
        local_20->shared = peVar4;
        peVar4 = ecs_type_add((ecs_world_t *)table_local,local_20->base_entities,
                              uVar1 & 0xffffffffffffff);
        local_20->base_entities = peVar4;
        peVar4 = ecs_type_add((ecs_world_t *)table_local,base_table_dbg.parent_entities,
                              uVar1 & 0xffffffffffffff);
        local_20->base_entities = peVar4;
      }
    }
    peVar5 = ecs_table_get_data((ecs_table_t *)dbg_out_local);
    if (peVar5 != (ecs_data_t *)0x0) {
      peVar6 = (ecs_entity_t *)_ecs_vector_first(peVar5->entities,8,0x10);
      local_20->entities = peVar6;
      iVar2 = ecs_vector_count(peVar5->entities);
      local_20->entities_count = iVar2;
    }
    return;
  }
  __assert_fail("table != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
                ,0x16,"void ecs_dbg_table(ecs_world_t *, ecs_table_t *, ecs_dbg_table_t *)");
}

Assistant:

void ecs_dbg_table(
    ecs_world_t *world, 
    ecs_table_t *table, 
    ecs_dbg_table_t *dbg_out)
{
    ecs_assert(dbg_out != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(table != NULL, ECS_INVALID_PARAMETER, NULL);

    *dbg_out = (ecs_dbg_table_t){.table = table};

    dbg_out->type = table->type;
    dbg_out->systems_matched = table->queries;

    /* Determine components from parent/base entities */
    ecs_entity_t *entities = ecs_vector_first(table->type, ecs_entity_t);
    int32_t i, count = ecs_vector_count(table->type);

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        if (ECS_HAS_ROLE(e, CHILDOF)) {
            ecs_dbg_entity_t parent_dbg;
            ecs_dbg_entity(world, e & ECS_COMPONENT_MASK, &parent_dbg);

            ecs_dbg_table_t parent_table_dbg;
            ecs_dbg_table(world, parent_dbg.table, &parent_table_dbg);

            /* Owned and shared components are available from container */
            dbg_out->container = ecs_type_merge(
                world, dbg_out->container, parent_dbg.type, NULL);
            dbg_out->container = ecs_type_merge(
                world, dbg_out->container, parent_table_dbg.shared, NULL);

            /* Add entity to list of parent entities */
            dbg_out->parent_entities = ecs_type_add(
                world, dbg_out->parent_entities, e & ECS_COMPONENT_MASK);
        }

        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            ecs_dbg_entity_t base_dbg;
            ecs_dbg_entity(world, e & ECS_COMPONENT_MASK, &base_dbg);

            ecs_dbg_table_t base_table_dbg;
            ecs_dbg_table(world, base_dbg.table, &base_table_dbg);            

            /* Owned and shared components are available from base */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, base_dbg.type, NULL);
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, base_table_dbg.shared, NULL);

            /* Never inherit EcsName or EcsPrefab */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, ecs_type(EcsName));
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, ecs_type_from_entity(world, EcsPrefab));

            /* Shared components are always masked by owned components */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, table->type);

            /* Add entity to list of base entities */
            dbg_out->base_entities = ecs_type_add(
                world, dbg_out->base_entities, e & ECS_COMPONENT_MASK);

            /* Add base entities of entity to list of base entities */
            dbg_out->base_entities = ecs_type_add(
                world, base_table_dbg.base_entities, e & ECS_COMPONENT_MASK);                                                       
        }
    }

    ecs_data_t *data = ecs_table_get_data(table);
    if (data) {
        dbg_out->entities = ecs_vector_first(data->entities, ecs_entity_t);
        dbg_out->entities_count = ecs_vector_count(data->entities);
    }
}